

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

void Saig_StrSimPrepareAig(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  Aig_ManReprStart(p,iVar1);
  iVar1 = Aig_ManObjNumMax(p);
  pVVar2 = Vec_PtrAllocSimInfo(iVar1,0x10);
  p->pData2 = pVVar2;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar3 = Vec_PtrEntry(p->vObjs,local_1c);
    if (pvVar3 != (void *)0x0) {
      pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)p->pData2,local_1c);
      *(void **)((long)pvVar3 + 0x28) = pvVar4;
    }
  }
  pAVar5 = Aig_ManConst1(p);
  Saig_StrSimAssignOne(pAVar5);
  for (local_1c = 0; iVar1 = Saig_ManRegNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pVVar2 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar2,local_1c + iVar1);
    Saig_StrSimAssignZeroInit(pAVar5);
  }
  return;
}

Assistant:

void Saig_StrSimPrepareAig( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManReprStart( p, Aig_ManObjNumMax(p) );
    // allocate simulation info
    p->pData2 = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p), SAIG_WORDS );
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = Vec_PtrEntry( (Vec_Ptr_t *)p->pData2, i );
    // set simulation info for constant1 and register outputs
    Saig_StrSimAssignOne( Aig_ManConst1(p) );
    Saig_ManForEachLo( p, pObj, i )
        Saig_StrSimAssignZeroInit( pObj );
}